

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O1

void __thiscall Chromosome::Chromosome(Chromosome *this,size_t g,size_t as)

{
  this->_vptr_Chromosome = (_func_int **)&PTR__Chromosome_0011d8a0;
  this->CHROMOSOME_SIZE = 0x32;
  this->ALLELE_SIZE = as;
  (this->genes).super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->genes).super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->genes).super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (g != 0) {
    do {
      add_gene(this,(value_type)0x0);
      g = g - 1;
    } while (g != 0);
  }
  Randomize_genes(this);
  return;
}

Assistant:

Chromosome::Chromosome( size_t g, size_t as ) :
	CHROMOSOME_SIZE(CHROMSIZE), ALLELE_SIZE(as)
{
	for(size_t i = 0; i < g; ++i)
	{
		add_gene();
	}

	Randomize_genes();

}